

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.c
# Opt level: O0

void test_encode(void)

{
  uint8_t *in;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char local_420 [4];
  int rv;
  char name [8];
  char buf [1024];
  void *dec;
  int i;
  
  dec._4_4_ = 0;
  while (in = (uint8_t *)cases[(int)dec._4_4_].decoded, in != (uint8_t *)0x0) {
    snprintf(local_420,8,"%d",(ulong)dec._4_4_);
    acutest_case_("%s",local_420);
    sVar2 = strlen((char *)in);
    sVar3 = nni_base64_encode(in,sVar2,name,0x400);
    iVar1 = (int)sVar3;
    acutest_check_((uint)(-1 < iVar1),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/websocket/base64_test.c"
                   ,0x31,"%s","rv >= 0");
    sVar2 = strlen(cases[(int)dec._4_4_].encoded);
    acutest_check_((uint)(iVar1 == (int)sVar2),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/websocket/base64_test.c"
                   ,0x32,"%s","rv == (int) strlen(cases[i].encoded)");
    name[iVar1] = '\0';
    iVar1 = strcmp(name,cases[(int)dec._4_4_].encoded);
    acutest_check_((uint)(iVar1 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/websocket/base64_test.c"
                   ,0x34,"%s","strcmp(buf, cases[i].encoded) == 0");
    dec._4_4_ = dec._4_4_ + 1;
  }
  return;
}

Assistant:

void
test_encode(void)
{
	int   i;
	void *dec;

	for (i = 0; (dec = cases[i].decoded) != NULL; i++) {
		char buf[1024];
		char name[8];
		int  rv;

		(void) snprintf(name, sizeof(name), "%d", i);
		TEST_CASE(name);
		rv = (int) nni_base64_encode(dec, strlen(dec), buf, 1024);
		TEST_CHECK(rv >= 0);
		TEST_CHECK(rv == (int) strlen(cases[i].encoded));
		buf[rv] = 0;
		TEST_CHECK(strcmp(buf, cases[i].encoded) == 0);
	}
}